

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclientconnector.hpp
# Opt level: O1

string * __thiscall
TestClientConnector::Send(string *__return_storage_ptr__,TestClientConnector *this,string *r)

{
  pointer pcVar1;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string_const&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_28,r,(parser_callback_t *)&local_48,true,false);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(&this->request,&local_28);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_28);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->raw_response)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->raw_response)._M_string_length)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string Send(const std::string &r) override {
    this->request = json::parse(r);
    return raw_response;
  }